

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_context_create_compiler
          (spvc_context context,spvc_backend backend,spvc_parsed_ir parsed_ir,spvc_capture_mode mode
          ,spvc_compiler *compiler)

{
  Compiler *pCVar1;
  spvc_result sVar2;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> _Var3;
  CompilerMSL *this;
  pointer *__ptr;
  string *this_00;
  __uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
  local_b8 [5];
  string local_90;
  string local_70;
  string local_50;
  
  _Var3._M_head_impl = (ScratchMemoryAllocation *)operator_new(0x20,(nothrow_t *)&std::nothrow);
  if ((_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)_Var3._M_head_impl ==
      (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)0x0) {
    std::__cxx11::string::string((string *)&local_50,"Out of memory.",(allocator *)local_b8);
    spvc_context_s::report_error(context,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    return SPVC_ERROR_OUT_OF_MEMORY;
  }
  ((ScratchMemoryAllocation *)&(_Var3._M_head_impl)->_vptr_ScratchMemoryAllocation)->
  _vptr_ScratchMemoryAllocation = (_func_int **)&PTR__spvc_compiler_s_004e89a8;
  (((unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_> *)
   (_Var3._M_head_impl + 2))->_M_t).
  super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>._M_t.
  super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>.
  super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl = (Compiler *)0x0;
  *(spvc_backend *)(_Var3._M_head_impl + 3) = backend;
  _Var3._M_head_impl[1] = (ScratchMemoryAllocation)context;
  if (mode < 2) {
    switch(backend) {
    case SPVC_BACKEND_NONE:
      if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
        this = (CompilerMSL *)operator_new(0xc68);
        spirv_cross::Compiler::Compiler((Compiler *)this,&parsed_ir->parsed);
      }
      else {
        this = (CompilerMSL *)operator_new(0xc68);
        spirv_cross::Compiler::Compiler((Compiler *)this,&parsed_ir->parsed);
      }
      break;
    case SPVC_BACKEND_GLSL:
      if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
        this = (CompilerMSL *)operator_new(0x2678);
        spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,&parsed_ir->parsed);
      }
      else {
        this = (CompilerMSL *)operator_new(0x2678);
        spirv_cross::CompilerGLSL::CompilerGLSL((CompilerGLSL *)this,&parsed_ir->parsed);
      }
      break;
    case SPVC_BACKEND_HLSL:
      if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
        this = (CompilerMSL *)operator_new(0x2920);
        spirv_cross::CompilerHLSL::CompilerHLSL((CompilerHLSL *)this,&parsed_ir->parsed);
      }
      else {
        this = (CompilerMSL *)operator_new(0x2920);
        spirv_cross::CompilerHLSL::CompilerHLSL((CompilerHLSL *)this,&parsed_ir->parsed);
      }
      break;
    case SPVC_BACKEND_MSL:
      if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
        this = (CompilerMSL *)operator_new(0x30b0);
        spirv_cross::CompilerMSL::CompilerMSL(this,&parsed_ir->parsed);
      }
      else {
        this = (CompilerMSL *)operator_new(0x30b0);
        spirv_cross::CompilerMSL::CompilerMSL(this,&parsed_ir->parsed);
      }
      break;
    case SPVC_BACKEND_CPP:
      if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
        this = (CompilerMSL *)operator_new(0x27f8);
        spirv_cross::CompilerCPP::CompilerCPP((CompilerCPP *)this,&parsed_ir->parsed);
      }
      else {
        this = (CompilerMSL *)operator_new(0x27f8);
        spirv_cross::CompilerCPP::CompilerCPP((CompilerCPP *)this,&parsed_ir->parsed);
      }
      break;
    case SPVC_BACKEND_JSON:
      if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP) {
        this = (CompilerMSL *)operator_new(0x2688);
        spirv_cross::CompilerReflection::CompilerReflection
                  ((CompilerReflection *)this,&parsed_ir->parsed);
      }
      else {
        this = (CompilerMSL *)operator_new(0x2688);
        spirv_cross::CompilerReflection::CompilerReflection
                  ((CompilerReflection *)this,&parsed_ir->parsed);
      }
      break;
    default:
      std::__cxx11::string::string((string *)&local_90,"Invalid backend.",(allocator *)local_b8);
      spvc_context_s::report_error(context,&local_90);
      this_00 = &local_90;
      goto LAB_001e3f7c;
    }
    pCVar1 = (((unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_> *)
              (_Var3._M_head_impl + 2))->_M_t).
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    (((unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_> *)
     (_Var3._M_head_impl + 2))->_M_t).
    super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>._M_t.
    super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>.
    super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl = (Compiler *)this;
    if (pCVar1 != (Compiler *)0x0) {
      (*pCVar1->_vptr_Compiler[1])();
    }
    *compiler = (spvc_compiler)_Var3._M_head_impl;
    local_b8[0]._M_t.
    super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
    .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
         (tuple<ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>)
         (tuple<ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>)
         _Var3._M_head_impl;
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::push_back(&context->allocations,
                (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)local_b8);
    if ((_Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>)
        local_b8[0]._M_t.
        super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
        .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl !=
        (ScratchMemoryAllocation *)0x0) {
      (**(code **)(*(long *)local_b8[0]._M_t.
                            super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
                            .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                  8))();
    }
    sVar2 = SPVC_SUCCESS;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_70,"Invalid argument for capture mode.",(allocator *)local_b8);
    spvc_context_s::report_error(context,&local_70);
    this_00 = &local_70;
LAB_001e3f7c:
    std::__cxx11::string::~string((string *)this_00);
    (*((ScratchMemoryAllocation *)&(_Var3._M_head_impl)->_vptr_ScratchMemoryAllocation)->
      _vptr_ScratchMemoryAllocation[1])(_Var3._M_head_impl);
    sVar2 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return sVar2;
}

Assistant:

spvc_result spvc_context_create_compiler(spvc_context context, spvc_backend backend, spvc_parsed_ir parsed_ir,
                                         spvc_capture_mode mode, spvc_compiler *compiler)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_compiler_s> comp(new (std::nothrow) spvc_compiler_s);
		if (!comp)
		{
			context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}
		comp->backend = backend;
		comp->context = context;

		if (mode != SPVC_CAPTURE_MODE_COPY && mode != SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
		{
			context->report_error("Invalid argument for capture mode.");
			return SPVC_ERROR_INVALID_ARGUMENT;
		}

		switch (backend)
		{
		case SPVC_BACKEND_NONE:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new Compiler(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new Compiler(parsed_ir->parsed));
			break;

#if SPIRV_CROSS_C_API_GLSL
		case SPVC_BACKEND_GLSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerGLSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerGLSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_HLSL
		case SPVC_BACKEND_HLSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerHLSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerHLSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_MSL
		case SPVC_BACKEND_MSL:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerMSL(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerMSL(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_CPP
		case SPVC_BACKEND_CPP:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerCPP(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerCPP(parsed_ir->parsed));
			break;
#endif

#if SPIRV_CROSS_C_API_REFLECT
		case SPVC_BACKEND_JSON:
			if (mode == SPVC_CAPTURE_MODE_TAKE_OWNERSHIP)
				comp->compiler.reset(new CompilerReflection(std::move(parsed_ir->parsed)));
			else if (mode == SPVC_CAPTURE_MODE_COPY)
				comp->compiler.reset(new CompilerReflection(parsed_ir->parsed));
			break;
#endif

		default:
			context->report_error("Invalid backend.");
			return SPVC_ERROR_INVALID_ARGUMENT;
		}

		*compiler = comp.get();
		context->allocations.push_back(std::move(comp));
	}